

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O0

callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
 __thiscall
cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string_const&)>
          (manager *this,string *plugin_name,string *entry_name)

{
  undefined1 uVar1;
  string *psVar2;
  undefined8 uVar3;
  refcounted *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_RDX;
  callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  pointer_type ptr;
  callable_type *real_call;
  refcounted_ptr call;
  entry_point_type plugin_call;
  callback_type *result;
  string *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  pointer_type __lhs_00;
  string local_230 [192];
  string local_170 [32];
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *local_150;
  undefined1 local_141;
  intrusive_ptr<booster::refcounted> local_c0 [11];
  undefined1 local_b5;
  code *local_28;
  string *local_18;
  
  __lhs_00.p_ = in_RDI;
  local_18 = in_RDX;
  psVar2 = (string *)cppcms::plugin::manager::instance();
  local_28 = (code *)cppcms::plugin::manager::get_entry(psVar2,local_18);
  if (local_28 == (code *)0x0) {
    local_b5 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::operator+((char *)__lhs_00.p_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_b5 = 0;
    __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  (*local_28)();
  uVar1 = booster::intrusive_ptr<booster::refcounted>::operator!(local_c0);
  if ((bool)uVar1) {
    local_141 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::operator+((char *)__lhs_00.p_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_141 = 0;
    __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  prVar4 = booster::intrusive_ptr<booster::refcounted>::get(local_c0);
  if (prVar4 == (refcounted *)0x0) {
    local_150 = (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)0x0;
  }
  else {
    local_150 = (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)__dynamic_cast(prVar4,&booster::refcounted::typeinfo,
                                  &booster::
                                   callable<std::__cxx11::string(std::__cxx11::string_const&)>::
                                   typeinfo,0);
  }
  if (local_150 !=
      (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
       *)0x0) {
    booster::
    intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::intrusive_ptr(local_150,in_stack_fffffffffffffd68,
                    SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
    booster::
    intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                     *)in_stack_fffffffffffffd60,
                    (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                     *)in_stack_fffffffffffffd58);
    booster::callback<std::__cxx11::string(std::__cxx11::string_const&)>::
    callback<booster::callable<std::__cxx11::string(std::__cxx11::string_const&)>>
              ((callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)in_stack_fffffffffffffd60,
               (intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                *)in_stack_fffffffffffffd58);
    booster::
    intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      *)in_stack_fffffffffffffd60);
    booster::
    intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                      *)in_stack_fffffffffffffd60);
    booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr
              ((intrusive_ptr<booster::refcounted> *)in_stack_fffffffffffffd60);
    return (callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            )(pointer_type)__lhs_00.p_;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x48);
  std::operator+((char *)__lhs_00.p_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd60);
  std::operator+(__lhs,in_stack_fffffffffffffd60);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffd60);
  psVar2 = (string *)cppcms::plugin::manager::instance();
  cppcms::plugin::manager::signature(local_230,psVar2);
  std::operator+(in_stack_fffffffffffffd98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffd90));
  std::operator+(__lhs,(char *)psVar2);
  cppcms::plugin::signature_error::signature_error((signature_error *)__lhs,local_170);
  __cxa_throw(__lhs,&signature_error::typeinfo,cppcms::plugin::signature_error::~signature_error);
}

Assistant:

booster::callback<Signature>
	entry(std::string const &plugin_name,std::string const &entry_name)
	{
		typedef booster::callback<Signature> callback_type;
		typedef typename callback_type::callable_type callable_type;
		typedef typename callback_type::pointer_type pointer_type;

		entry_point_type plugin_call = instance().get_entry(plugin_name,entry_name);
		if(!plugin_call)
			throw cppcms_error("Could not find entry `" + entry_name + "' in plugin `" + plugin_name + "'");
		refcounted_ptr call = plugin_call();
		if(!call)
			throw cppcms_error("Failed to create callback from plugin `"+plugin_name+"':entry `" + entry_name + "'");

		callable_type *real_call = dynamic_cast<callable_type *>(call.get());
		if(!real_call) {
			throw signature_error("Invalid signature request in plugin `"+ plugin_name +"':entry `"+entry_name+"', expected following signaure `" + instance().signature(plugin_name,entry_name) + "'");
		}
		pointer_type ptr(real_call);
		callback_type result(ptr);
		return result;
	}